

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldStatePdu.cpp
# Opt level: O3

void __thiscall DIS::MinefieldStatePdu::MinefieldStatePdu(MinefieldStatePdu *this)

{
  MinefieldFamilyPdu::MinefieldFamilyPdu(&this->super_MinefieldFamilyPdu);
  (this->super_MinefieldFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__MinefieldStatePdu_001a0918;
  EntityID::EntityID(&this->_minefieldID);
  this->_minefieldSequence = 0;
  this->_forceID = '\0';
  this->_numberOfPerimeterPoints = '\0';
  EntityType::EntityType(&this->_minefieldType);
  this->_numberOfMineTypes = 0;
  Vector3Double::Vector3Double(&this->_minefieldLocation);
  Orientation::Orientation(&this->_minefieldOrientation);
  this->_appearance = 0;
  this->_protocolMode = 0;
  (this->_perimeterPoints).super__Vector_base<DIS::Point,_std::allocator<DIS::Point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_perimeterPoints).super__Vector_base<DIS::Point,_std::allocator<DIS::Point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_perimeterPoints).super__Vector_base<DIS::Point,_std::allocator<DIS::Point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_mineType).super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_mineType).super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_mineType).super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Pdu::setPduType((Pdu *)this,'%');
  return;
}

Assistant:

MinefieldStatePdu::MinefieldStatePdu() : MinefieldFamilyPdu(),
   _minefieldID(), 
   _minefieldSequence(0), 
   _forceID(0), 
   _numberOfPerimeterPoints(0), 
   _minefieldType(), 
   _numberOfMineTypes(0), 
   _minefieldLocation(), 
   _minefieldOrientation(), 
   _appearance(0), 
   _protocolMode(0)
{
    setPduType( 37 );
}